

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

bool __thiscall google::protobuf::internal::ExtensionSet::Has(ExtensionSet *this,int number)

{
  byte bVar1;
  const_iterator cVar2;
  LogMessage *other;
  LogFinisher local_4d;
  int number_local;
  LogMessage local_48;
  
  number_local = number;
  cVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                  *)this,&number_local);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->extensions_)._M_t._M_impl.super__Rb_tree_header) {
    bVar1 = 0;
  }
  else {
    if (*(char *)((long)&cVar2._M_node[1]._M_left + 1) == '\x01') {
      LogMessage::LogMessage
                (&local_48,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0xcf);
      other = LogMessage::operator<<(&local_48,"CHECK failed: !iter->second.is_repeated: ");
      LogFinisher::operator=(&local_4d,other);
      LogMessage::~LogMessage(&local_48);
    }
    bVar1 = *(byte *)((long)&cVar2._M_node[1]._M_left + 2) ^ 1;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool ExtensionSet::Has(int number) const {
  ExtensionMap::const_iterator iter = extensions_.find(number);
  if (iter == extensions_.end()) return false;
  GOOGLE_DCHECK(!iter->second.is_repeated);
  return !iter->second.is_cleared;
}